

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O2

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)

{
  char cVar1;
  SQChar SVar2;
  int iVar3;
  long lVar4;
  SQChar *pSVar5;
  long lVar6;
  longlong lVar7;
  size_t sVar8;
  SQRESULT SVar9;
  SQChar *pSVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  SQInteger ti;
  size_t local_a0;
  long local_98;
  SQFloat tf;
  long local_88;
  SQChar *ts;
  SQChar fmt [20];
  SQChar *format;
  long local_50;
  long local_48;
  SQInteger *local_40;
  SQChar **local_38;
  
  local_40 = outlen;
  local_38 = output;
  sq_getstring(v,nformatstringidx,&format);
  lVar4 = sq_getsize(v,nformatstringidx);
  local_a0 = lVar4 + 2;
  pSVar5 = (SQChar *)sq_getscratchpad(v);
  local_98 = 0;
  lVar12 = 0;
  lVar11 = 0;
  local_48 = lVar4;
LAB_0010921e:
  local_88 = nformatstringidx + 1;
  do {
    if (local_48 <= lVar12) {
      *local_40 = lVar11;
      pSVar5[lVar11] = '\0';
      *local_38 = pSVar5;
      return 0;
    }
    if (format[lVar12] == '%') {
      if (format[lVar12 + 1] != '%') break;
      pSVar5[lVar11] = '%';
      lVar12 = lVar12 + 2;
    }
    else {
      pSVar5[lVar11] = format[lVar12];
      lVar12 = lVar12 + 1;
    }
    lVar11 = lVar11 + 1;
  } while( true );
  lVar4 = sq_gettop(v);
  pSVar5 = format;
  if (lVar4 <= nformatstringidx) {
    pcVar13 = "not enough parameters for the given format string";
    goto LAB_001095d7;
  }
  lVar4 = lVar12 + 1;
  fmt[0] = '%';
  pcVar13 = format + lVar12 + 2;
  lVar12 = lVar12 + 2;
  lVar14 = lVar4;
  while (((ulong)(byte)format[lVar14] < 0x31 &&
         ((0x1280900000000U >> ((ulong)(byte)format[lVar14] & 0x3f) & 1) != 0))) {
    lVar14 = lVar14 + 1;
    lVar12 = lVar12 + 1;
    pcVar13 = pcVar13 + 1;
  }
  lVar6 = 0;
  do {
    if (9 < (int)format[lVar14] - 0x30U) {
      *(undefined1 *)((long)&ti + lVar6) = 0;
      if (lVar6 == 0) {
        local_98 = 0;
      }
      else {
        local_50 = lVar4;
        local_98 = strtoll((char *)&ti,&ts,10);
        lVar4 = local_50;
      }
      nformatstringidx = local_88;
      if (pSVar5[lVar14] != '.') goto LAB_0010939c;
      lVar6 = 0;
      goto LAB_00109337;
    }
    *(SQChar *)((long)&ti + lVar6) = format[lVar14];
    lVar14 = lVar14 + 1;
    lVar6 = lVar6 + 1;
    lVar12 = lVar12 + 1;
    pcVar13 = pcVar13 + 1;
  } while (lVar6 != 3);
  pcVar13 = "width format too long";
LAB_001093b7:
  lVar14 = sq_throwerror(v,pcVar13);
  nformatstringidx = local_88;
LAB_001093e0:
  if (lVar14 < 0) {
    return -1;
  }
  ts = (SQChar *)0x0;
  ti = 0;
  tf = 0.0;
  cVar1 = format[lVar14];
  switch(cVar1) {
  case 'd':
  case 'i':
  case 'o':
  case 'u':
  case 'x':
switchD_0010941d_caseD_64:
    sVar8 = strlen(fmt);
    SVar2 = fmt[sVar8 - 1];
    (fmt + (sVar8 - 1))[0] = 'l';
    (fmt + (sVar8 - 1))[1] = 'l';
    fmt[sVar8 + 1] = SVar2;
    fmt[sVar8 + 2] = '\0';
  case 'c':
    lVar4 = sq_getinteger(v,nformatstringidx,&ti);
    if (lVar4 < 0) {
      pcVar13 = "integer expected for the specified format";
      goto LAB_001095d7;
    }
    sVar8 = local_a0 + local_98 + 0x66;
    pSVar5 = (SQChar *)sq_getscratchpad(v,sVar8);
    pSVar10 = (SQChar *)ti;
    local_a0 = sVar8;
    break;
  case 'e':
  case 'f':
  case 'g':
    goto switchD_0010941d_caseD_65;
  case 'h':
  case 'j':
  case 'k':
  case 'l':
  case 'm':
  case 'n':
  case 'p':
  case 'q':
  case 'r':
  case 't':
  case 'v':
  case 'w':
switchD_0010941d_caseD_68:
    pcVar13 = "invalid format";
    goto LAB_001095d7;
  case 's':
    lVar4 = sq_getstring(v,nformatstringidx,&ts);
    if (lVar4 < 0) {
      pcVar13 = "string expected for the specified format";
      goto LAB_001095d7;
    }
    lVar4 = sq_getsize(v,nformatstringidx);
    local_a0 = local_a0 + local_98 + lVar4 + 2;
    pSVar5 = (SQChar *)sq_getscratchpad(v);
    pSVar10 = ts;
    break;
  default:
    if ((cVar1 != 'E') && (cVar1 != 'G')) {
      if (cVar1 != 'X') goto switchD_0010941d_caseD_68;
      goto switchD_0010941d_caseD_64;
    }
    goto switchD_0010941d_caseD_65;
  }
  iVar3 = snprintf(pSVar5 + lVar11,local_a0,fmt,pSVar10);
LAB_00109510:
  lVar11 = iVar3 + lVar11;
  lVar12 = lVar14 + 1;
  goto LAB_0010921e;
LAB_00109337:
  if ((int)*pcVar13 - 0x30U < 10) goto code_r0x00109344;
  *(undefined1 *)((long)&ti + lVar6) = 0;
  lVar14 = lVar12;
  if (lVar6 != 0) {
    lVar7 = strtoll((char *)&ti,&ts,10);
    local_98 = local_98 + lVar7;
  }
LAB_0010939c:
  lVar12 = lVar14 - lVar4;
  if (0x14 < lVar12) {
    pcVar13 = "format too long";
    goto LAB_001093b7;
  }
  memcpy(fmt + 1,pSVar5 + lVar4,lVar12 + 1);
  fmt[lVar12 + 2] = '\0';
  nformatstringidx = local_88;
  goto LAB_001093e0;
code_r0x00109344:
  *(char *)((long)&ti + lVar6) = *pcVar13;
  lVar6 = lVar6 + 1;
  lVar12 = lVar12 + 1;
  pcVar13 = pcVar13 + 1;
  if (lVar6 == 3) goto code_r0x00109357;
  goto LAB_00109337;
code_r0x00109357:
  lVar14 = sq_throwerror(v,"precision format too long");
  goto LAB_001093e0;
switchD_0010941d_caseD_65:
  lVar4 = sq_getfloat(v,nformatstringidx,&tf);
  if (lVar4 < 0) {
    pcVar13 = "float expected for the specified format";
LAB_001095d7:
    SVar9 = sq_throwerror(v,pcVar13);
    return SVar9;
  }
  sVar8 = local_a0 + local_98 + 0x66;
  pSVar5 = (SQChar *)sq_getscratchpad(v,sVar8);
  local_a0 = sVar8;
  iVar3 = snprintf(pSVar5 + lVar11,sVar8,fmt,(double)tf);
  goto LAB_00109510;
}

Assistant:

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)
{
    const SQChar *format;
    SQChar *dest;
    SQChar fmt[MAX_FORMAT_LEN];
    sq_getstring(v,nformatstringidx,&format);
    SQInteger format_size = sq_getsize(v,nformatstringidx);
    SQInteger allocated = (format_size+2)*sizeof(SQChar);
    dest = sq_getscratchpad(v,allocated);
    SQInteger n = 0,i = 0, nparam = nformatstringidx+1, w = 0;
    //while(format[n] != '\0')
    while(n < format_size)
    {
        if(format[n] != '%') {
            assert(i < allocated);
            dest[i++] = format[n];
            n++;
        }
        else if(format[n+1] == '%') { //handles %%
                dest[i++] = '%';
                n += 2;
        }
        else {
            n++;
            if( nparam > sq_gettop(v) )
                return sq_throwerror(v,_SC("not enough parameters for the given format string"));
            n = validate_format(v,fmt,format,n,w);
            if(n < 0) return -1;
            SQInteger addlen = 0;
            SQInteger valtype = 0;
            const SQChar *ts = NULL;
            SQInteger ti = 0;
            SQFloat tf = 0;
            switch(format[n]) {
            case 's':
                if(SQ_FAILED(sq_getstring(v,nparam,&ts)))
                    return sq_throwerror(v,_SC("string expected for the specified format"));
                addlen = (sq_getsize(v,nparam)*sizeof(SQChar))+((w+1)*sizeof(SQChar));
                valtype = 's';
                break;
            case 'i': case 'd': case 'o': case 'u':  case 'x':  case 'X':
#ifdef _SQ64
                {
                size_t flen = scstrlen(fmt);
                SQInteger fpos = flen - 1;
                SQChar f = fmt[fpos];
                const SQChar *prec = (const SQChar *)_PRINT_INT_PREC;
                while(*prec != _SC('\0')) {
                    fmt[fpos++] = *prec++;
                }
                fmt[fpos++] = f;
                fmt[fpos++] = _SC('\0');
                }
#endif
            case 'c':
                if(SQ_FAILED(sq_getinteger(v,nparam,&ti)))
                    return sq_throwerror(v,_SC("integer expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'i';
                break;
            case 'f': case 'g': case 'G': case 'e':  case 'E':
                if(SQ_FAILED(sq_getfloat(v,nparam,&tf)))
                    return sq_throwerror(v,_SC("float expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'f';
                break;
            default:
                return sq_throwerror(v,_SC("invalid format"));
            }
            n++;
            allocated += addlen + sizeof(SQChar);
            dest = sq_getscratchpad(v,allocated);
            switch(valtype) {
            case 's': i += scsprintf(&dest[i],allocated,fmt,ts); break;
            case 'i': i += scsprintf(&dest[i],allocated,fmt,ti); break;
            case 'f': i += scsprintf(&dest[i],allocated,fmt,tf); break;
            };
            nparam ++;
        }
    }
    *outlen = i;
    dest[i] = '\0';
    *output = dest;
    return SQ_OK;
}